

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observables.hh
# Opt level: O0

double __thiscall SSM::SwitchObservable::convert(SwitchObservable *this,const_iterator input)

{
  byte bVar1;
  int iVar2;
  reference pbVar3;
  double local_30;
  Byte bitmask;
  Byte value;
  SwitchObservable *this_local;
  const_iterator input_local;
  
  this_local = (SwitchObservable *)input._M_current;
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
           ::operator*((__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                        *)&this_local);
  bVar1 = *pbVar3;
  iVar2 = (*(this->super_Observable)._vptr_Observable[4])();
  local_30 = 0.0;
  if ((bVar1 & '\x01' << ((byte)iVar2 & 0x1f)) != 0) {
    local_30 = 1.0;
  }
  return local_30;
}

Assistant:

double convert(Bytes::const_iterator input) const override
    {
      Byte value = *input;
      Byte bitmask = Byte(0x01) << markerBit();
      return ((value & bitmask) == Byte(0x00)) ? 0.0 : 1.0;
    }